

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDie,_true> *this,DWARFDie *Elt)

{
  size_t sVar1;
  size_t sVar2;
  iterator pDVar3;
  DWARFDie *Elt_local;
  SmallVectorTemplateBase<llvm::DWARFDie,_true> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    grow(this,0);
  }
  pDVar3 = SmallVectorTemplateCommon<llvm::DWARFDie,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>);
  pDVar3->U = Elt->U;
  pDVar3->Die = Elt->Die;
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }